

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O2

void __thiscall
bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithQualifier_Test::
~ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithQualifier_Test
          (ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithQualifier_Test *this)

{
  anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithQualifier_Test::
  ~ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithQualifier_Test
            ((ParseCertificatePoliciesExtensionOidsTest_OnePolicyWithQualifier_Test *)(this + -0x10)
            );
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, OnePolicyWithQualifier) {
  std::string der;
  ASSERT_TRUE(LoadTestData("policy_1_2_3_with_qualifier.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(1U, policies.size());
  EXPECT_EQ(der::Input(policy_1_2_3_der), policies[0]);
}